

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  size_t n;
  long lVar1;
  size_t n_2;
  int R [5];
  int T [10];
  
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    T[lVar1] = 0;
  }
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    R[lVar1] = 10;
  }
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    printf("%d ",(ulong)(uint)T[lVar1]);
  }
  putchar(10);
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    printf("%d ",(ulong)(uint)R[lVar1]);
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int T[10];
  int R[5];

  for (size_t n = 0; n < 10; n++) {
    T[n] = 0;
  }
  for (size_t n = 0; n < 5; n++) {
    R[n] = 10;
  }

  for (size_t n = 0; n < 10; n++) {
    printf("%d ", T[n]);
  }
  printf("\n");
  for (size_t n = 0; n < 5; n++) {
    printf("%d ", R[n]);
  }
  printf("\n");
}